

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall fmt::v10::detail::utf8_to_utf16::utf8_to_utf16(utf8_to_utf16 *this,string_view s)

{
  wchar_t *pwVar1;
  char *pcVar2;
  type __n;
  char *buf_ptr;
  size_t sVar3;
  char *pcVar4;
  char *ptr;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar5;
  char *extraout_RDX_02;
  char *pcVar6;
  char *buf_ptr_00;
  ulong uVar7;
  detail *this_00;
  anon_class_8_1_54a39806 decode;
  char acStack_48 [8];
  anon_class_8_1_54a39806 local_40;
  wchar_t *local_38;
  
  pcVar4 = (char *)s.size_;
  pcVar6 = s.data_;
  buf_ptr = acStack_48;
  (this->buffer_).super_buffer<wchar_t>.size_ = 0;
  (this->buffer_).super_buffer<wchar_t>._vptr_buffer = (_func_int **)&PTR_grow_0021ff28;
  local_38 = (this->buffer_).store_;
  (this->buffer_).super_buffer<wchar_t>.ptr_ = local_38;
  (this->buffer_).super_buffer<wchar_t>.capacity_ = 500;
  pcVar5 = pcVar6;
  buf_ptr_00 = pcVar6;
  local_40.f.this = (anon_class_8_1_8991fb9c_for_f)(anon_class_8_1_8991fb9c_for_f)this;
  if (pcVar4 < (char *)0x4) {
LAB_0018dc24:
    this_00 = (detail *)(pcVar6 + (long)pcVar4 + -(long)buf_ptr_00);
    if (this_00 != (detail *)0x0) {
      acStack_48[4] = '\0';
      acStack_48[5] = '\0';
      acStack_48[6] = '\0';
      acStack_48[0] = '\0';
      acStack_48[1] = '\0';
      acStack_48[2] = '\0';
      acStack_48[3] = '\0';
      __n = to_unsigned<long>(this_00,(long)pcVar5);
      pcVar5 = extraout_RDX_00;
      if (__n != 0) {
        memcpy(acStack_48,buf_ptr_00,__n);
        pcVar5 = extraout_RDX_01;
      }
      do {
        buf_ptr = for_each_codepoint<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/format-inl.h:1396:25)>
                  ::anon_class_8_1_54a39806::operator()(&local_40,buf_ptr,pcVar5);
        if (buf_ptr == (char *)0x0) break;
        pcVar5 = extraout_RDX_02;
      } while ((long)buf_ptr - (long)acStack_48 < (long)this_00);
    }
  }
  else {
    ptr = pcVar4;
    do {
      if (pcVar6 + (long)pcVar4 + -3 <= buf_ptr_00) goto LAB_0018dc24;
      pcVar2 = for_each_codepoint<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/format-inl.h:1396:25)>
               ::anon_class_8_1_54a39806::operator()(&local_40,buf_ptr_00,ptr);
      ptr = extraout_RDX;
      pcVar5 = buf_ptr_00;
      buf_ptr_00 = pcVar2;
    } while (pcVar2 != (char *)0x0);
  }
  sVar3 = (this->buffer_).super_buffer<wchar_t>.size_;
  uVar7 = sVar3 + 1;
  if ((this->buffer_).super_buffer<wchar_t>.capacity_ < uVar7) {
    (**(this->buffer_).super_buffer<wchar_t>._vptr_buffer)(this);
    sVar3 = (this->buffer_).super_buffer<wchar_t>.size_;
    uVar7 = sVar3 + 1;
  }
  pwVar1 = (this->buffer_).super_buffer<wchar_t>.ptr_;
  (this->buffer_).super_buffer<wchar_t>.size_ = uVar7;
  pwVar1[sVar3] = L'\0';
  return;
}

Assistant:

FMT_FUNC detail::utf8_to_utf16::utf8_to_utf16(string_view s) {
  for_each_codepoint(s, [this](uint32_t cp, string_view) {
    if (cp == invalid_code_point) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
    return true;
  });
  buffer_.push_back(0);
}